

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# c2mir.c
# Opt level: O2

void * reg_malloc(c2m_ctx_t c2m_ctx,size_t s)

{
  VARR_void_ptr_t *pVVar1;
  void *pvVar2;
  void_ptr_t *__ptr;
  ulong uVar3;
  size_t sVar4;
  
  pvVar2 = malloc(s);
  if (pvVar2 == (void *)0x0) {
    (*c2m_ctx->error_func)(c2m_ctx,C_alloc_error,"no memory");
  }
  pVVar1 = c2m_ctx->reg_memory;
  __ptr = pVVar1->varr;
  if (__ptr != (void_ptr_t *)0x0) {
    sVar4 = pVVar1->els_num;
    uVar3 = sVar4 + 1;
    if (pVVar1->size < uVar3) {
      sVar4 = (uVar3 >> 1) + uVar3;
      __ptr = (void_ptr_t *)realloc(__ptr,sVar4 * 8);
      pVVar1->varr = __ptr;
      pVVar1->size = sVar4;
      sVar4 = pVVar1->els_num;
      uVar3 = sVar4 + 1;
    }
    pVVar1->els_num = uVar3;
    __ptr[sVar4] = pvVar2;
    return pvVar2;
  }
  mir_varr_assert_fail("expand","void_ptr_t");
}

Assistant:

static void *reg_malloc (c2m_ctx_t c2m_ctx, size_t s) {
  void *mem = malloc (s);

  if (mem == NULL) alloc_error (c2m_ctx, "no memory");
  VARR_PUSH (void_ptr_t, reg_memory, mem);
  return mem;
}